

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender __thiscall
fmt::v9::detail::digit_grouping<char>::apply<fmt::v9::appender,char>
          (digit_grouping<char> *this,appender out,basic_string_view<char> digits)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  undefined4 *puVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  undefined **local_828;
  undefined4 *local_820;
  ulong local_818;
  ulong local_810;
  undefined4 local_808 [502];
  
  uVar3 = digits.size_;
  puVar8 = local_808;
  local_828 = &PTR_grow_001db0b0;
  local_810 = 500;
  local_818 = 1;
  local_808[0] = 0;
  cVar1 = (this->sep_).thousands_sep;
  uVar9 = (uint)digits.size_;
  local_820 = puVar8;
  if (cVar1 != '\0') {
    pcVar6 = (this->sep_).grouping._M_dataplus._M_p;
    iVar10 = 0;
    do {
      pcVar5 = (this->sep_).grouping._M_dataplus._M_p + (this->sep_).grouping._M_string_length;
      if (pcVar6 == pcVar5) {
        cVar4 = pcVar5[-1];
      }
      else {
        cVar4 = *pcVar6;
        if ((byte)(cVar4 + 0x81U) < 0x82) goto LAB_001214f2;
        pcVar6 = pcVar6 + 1;
      }
      iVar10 = iVar10 + cVar4;
      if ((iVar10 == 0) || ((int)uVar9 <= iVar10)) goto LAB_001214f2;
      uVar11 = local_818 + 1;
      if (local_810 < uVar11) {
        (*(code *)*local_828)(&local_828,uVar11);
        uVar11 = local_818 + 1;
        cVar1 = (this->sep_).thousands_sep;
        puVar8 = local_820;
      }
      puVar8[local_818] = iVar10;
      local_818 = uVar11;
      if (cVar1 == '\0') goto LAB_001214f2;
    } while( true );
  }
  iVar10 = 0;
LAB_001214fd:
  if (0 < (int)uVar9) {
    uVar11 = 0;
    do {
      if ((int)uVar3 == local_820[iVar10]) {
        cVar1 = (this->sep_).thousands_sep;
        lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                container + 0x10);
        uVar7 = lVar2 + 1;
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                             container + 0x18) < uVar7) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
          lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x10);
          uVar7 = lVar2 + 1;
        }
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar7;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 8) + lVar2) = cVar1;
        iVar10 = iVar10 + -1;
      }
      cVar1 = digits.data_[uVar11];
      lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10);
      uVar7 = lVar2 + 1;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x18) < uVar7) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
        lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                container + 0x10);
        uVar7 = lVar2 + 1;
      }
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                0x10) = uVar7;
      *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                container + 8) + lVar2) = cVar1;
      uVar11 = uVar11 + 1;
      uVar3 = (ulong)((int)uVar3 - 1);
      puVar8 = local_820;
    } while ((uVar9 & 0x7fffffff) != uVar11);
  }
  if (puVar8 != local_808) {
    operator_delete(puVar8,local_810 << 2);
  }
  return (appender)
         out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
LAB_001214f2:
  iVar10 = (int)local_818 + -1;
  goto LAB_001214fd;
}

Assistant:

Out apply(Out out, basic_string_view<C> digits) const {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        *out++ = separator();
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }